

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O0

AutorunType __thiscall DiskGen::GetAutorun(DiskGen *this,char *buffer,uint size_of_buffer)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  pointer pRVar7;
  undefined8 *puVar8;
  char *searched_string;
  long lVar9;
  undefined8 uVar10;
  size_t sVar11;
  bool bVar12;
  int local_294;
  int i;
  int nbcar;
  bool bnewbinbas;
  uchar filename [16];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_268;
  iterator it_1;
  bool ext_binbas;
  __normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_> local_250;
  __normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_> local_248;
  iterator it;
  Rule local_228;
  Rule local_210;
  Rule local_1f8;
  Rule local_1e0;
  Rule local_1c8;
  Rule local_1b0;
  Rule local_198;
  Rule local_180;
  Rule local_168;
  Rule local_150;
  Rule local_138;
  Rule local_120;
  Rule local_108;
  Rule local_f0;
  Rule local_d8;
  Rule local_c0;
  Rule local_a8;
  undefined1 local_90 [8];
  vector<Rule,_std::allocator<Rule>_> rule_list;
  string local_68 [8];
  string disk_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filename_vector;
  int local_28;
  bool correct_hidden;
  int nb_correct_char;
  uint uStack_1c;
  bool end;
  AutorunType ret;
  uint size_of_buffer_local;
  char *buffer_local;
  DiskGen *this_local;
  
  bVar2 = false;
  local_28 = 0;
  bVar12 = true;
  uStack_1c = size_of_buffer;
  _ret = buffer;
  buffer_local = (char *)this;
  IDisk::GetCAT_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&disk_filename.field_2 + 8),this->disk_,(AutorunType *)&nb_correct_char,0);
  pcVar6 = GetCurrentLoadedDisk(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,pcVar6,
             (allocator<char> *)
             ((long)&rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rule_list.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<Rule,_std::allocator<Rule>_>::vector((vector<Rule,_std::allocator<Rule>_> *)local_90);
  GetAutorun::Rule::Rule(&local_a8,"disc","bin","DISC");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_a8);
  GetAutorun::Rule::Rule(&local_c0,"disk","bin","DISK");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_c0);
  GetAutorun::Rule::Rule(&local_d8,"disc","bas","DISC");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_d8);
  GetAutorun::Rule::Rule(&local_f0,"disk","bas","DISK");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_f0);
  GetAutorun::Rule::Rule(&local_108,"elite","bin","ELITE");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_108);
  GetAutorun::Rule::Rule(&local_120,"elite","bas","ELITE");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_120);
  GetAutorun::Rule::Rule(&local_138,"ubi","bin","UBI");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_138);
  GetAutorun::Rule::Rule(&local_150,"ubi","bas","UBI");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_150);
  GetAutorun::Rule::Rule(&local_168,"ubi","","UBI");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_168);
  GetAutorun::Rule::Rule(&local_180,"ere","bin","ERE.BAS");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_180);
  GetAutorun::Rule::Rule(&local_198,"ere","bas","ERE.BAS");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_198);
  GetAutorun::Rule::Rule(&local_1b0,"mbc","bin","MBC");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_1b0);
  GetAutorun::Rule::Rule(&local_1c8,"mbc","bas","MBC");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_1c8);
  GetAutorun::Rule::Rule(&local_1e0,"esat","bas","ESAT");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_1e0);
  GetAutorun::Rule::Rule(&local_1f8,"esat","bin","ESAT");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_1f8);
  GetAutorun::Rule::Rule(&local_210,"esat","","ESAT");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_210);
  GetAutorun::Rule::Rule(&local_228,"jeu","bin","JEU");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,&local_228);
  GetAutorun::Rule::Rule((Rule *)&it,"jeu","bas","JEU");
  std::vector<Rule,_std::allocator<Rule>_>::push_back
            ((vector<Rule,_std::allocator<Rule>_> *)local_90,(value_type *)&it);
  local_248._M_current =
       (Rule *)std::vector<Rule,_std::allocator<Rule>_>::begin
                         ((vector<Rule,_std::allocator<Rule>_> *)local_90);
  while( true ) {
    local_250._M_current =
         (Rule *)std::vector<Rule,_std::allocator<Rule>_>::end
                           ((vector<Rule,_std::allocator<Rule>_> *)local_90);
    bVar3 = __gnu_cxx::operator!=(&local_248,&local_250);
    if (!bVar3 || bVar2) break;
    pRVar7 = __gnu_cxx::__normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_>::
             operator->(&local_248);
    pcVar6 = pRVar7->name_;
    pRVar7 = __gnu_cxx::__normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_>::
             operator->(&local_248);
    bVar3 = FindName((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&disk_filename.field_2 + 8),pcVar6,pRVar7->ext_);
    pcVar6 = _ret;
    if (bVar3) {
      pRVar7 = __gnu_cxx::__normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_>::
               operator->(&local_248);
      strcpy(pcVar6,pRVar7->autofile_);
      bVar2 = true;
    }
    __gnu_cxx::__normal_iterator<Rule_*,_std::vector<Rule,_std::allocator<Rule>_>_>::operator++
              (&local_248,0);
  }
  it_1._M_current._7_1_ = 0;
  if (!bVar2) {
    local_268._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&disk_filename.field_2 + 8));
    while( true ) {
      local_270._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&disk_filename.field_2 + 8));
      bVar3 = __gnu_cxx::operator!=(&local_268,&local_270);
      if (!bVar3) break;
      memset(&nbcar,0,0x10);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_268);
      puVar8 = (undefined8 *)std::__cxx11::string::c_str();
      _nbcar = *puVar8;
      filename[4] = *(uchar *)((long)puVar8 + 0xc);
      filename._0_4_ = *(uint *)(puVar8 + 1) & 0xffff7f7f;
      bVar1 = 0;
      iVar4 = strncasecmp((char *)filename,"bin",3);
      if (((iVar4 == 0) || (iVar4 = strncasecmp((char *)filename,"bas",3), iVar4 == 0)) ||
         (iVar4 = strncasecmp((char *)filename,"   ",3), iVar4 == 0)) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_268);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        searched_string = (char *)std::__cxx11::string::c_str();
        iVar4 = std::__cxx11::string::size();
        iVar4 = NbIdenticalCar(pcVar6,searched_string,iVar4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_268);
        lVar9 = std::__cxx11::string::c_str();
        iVar5 = strncmp((char *)(lVar9 + 8),"BIN",3);
        if (iVar5 == 0) {
LAB_001d154f:
          bVar1 = 1;
        }
        else {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_268);
          lVar9 = std::__cxx11::string::c_str();
          iVar5 = strncmp((char *)(lVar9 + 8),"BAS",3);
          if (iVar5 == 0) goto LAB_001d154f;
        }
        if ((iVar4 <= local_28) && (local_28 != 0)) {
          if (bVar12) {
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_268);
            lVar9 = std::__cxx11::string::c_str();
            if (((int)*(char *)(lVar9 + 9) & 0x80U) == 0) goto LAB_001d15be;
          }
          if ((bVar1 != 1) || ((it_1._M_current._7_1_ & 1) != 0)) goto LAB_001d16e4;
        }
LAB_001d15be:
        if (!bVar12) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_268);
          lVar9 = std::__cxx11::string::c_str();
          if (((int)*(char *)(lVar9 + 9) & 0x80U) == 0x80) goto LAB_001d16e4;
        }
        if ((bVar1 != 0) || ((it_1._M_current._7_1_ & 1) != 1)) {
          it_1._M_current._7_1_ = bVar1;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_268);
          lVar9 = std::__cxx11::string::c_str();
          pcVar6 = _ret;
          bVar12 = ((int)*(char *)(lVar9 + 9) & 0x80U) != 0;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_268);
          uVar10 = std::__cxx11::string::c_str();
          sprintf(pcVar6,"%8.8s",uVar10);
          for (local_294 = 7; (local_28 = iVar4, -1 < local_294 && (_ret[local_294] == ' '));
              local_294 = local_294 + -1) {
            _ret[local_294] = '\0';
          }
        }
      }
LAB_001d16e4:
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_268,0);
    }
  }
  if ((bVar2) || (sVar11 = strlen(_ret), sVar11 != 0)) {
    nb_correct_char = 2;
  }
  iVar4 = nb_correct_char;
  std::vector<Rule,_std::allocator<Rule>_>::~vector((vector<Rule,_std::allocator<Rule>_> *)local_90)
  ;
  std::__cxx11::string::~string(local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&disk_filename.field_2 + 8));
  return iVar4;
}

Assistant:

IDisk::AutorunType DiskGen::GetAutorun(char* buffer, unsigned int size_of_buffer)
{
   IDisk::AutorunType ret;
   bool end = false;
   int nb_correct_char = 0;
   bool correct_hidden = 1;

   std::vector<std::string> filename_vector = disk_->GetCAT(ret);

   // Get disk name
   std::string disk_filename = GetCurrentLoadedDisk();

   // Specific rules : for specific disks !
   //todo

   // Generic Rules
   class Rule
   {
   public:
      Rule(const char* name, const char* ext, const char* autofile) : name_(name), ext_(ext), autofile_(autofile)
      {
      }

      const char* name_;
      const char* ext_;
      const char* autofile_;
   };

   std::vector<Rule> rule_list;
   rule_list.push_back(Rule("disc", "bin", "DISC"));
   rule_list.push_back(Rule("disk", "bin", "DISK"));
   rule_list.push_back(Rule("disc", "bas", "DISC"));
   rule_list.push_back(Rule("disk", "bas", "DISK"));
   rule_list.push_back(Rule("elite", "bin", "ELITE"));
   rule_list.push_back(Rule("elite", "bas", "ELITE"));
   rule_list.push_back(Rule("ubi", "bin", "UBI"));
   rule_list.push_back(Rule("ubi", "bas", "UBI"));
   rule_list.push_back(Rule("ubi", "", "UBI"));
   rule_list.push_back(Rule("ere", "bin", "ERE.BAS"));
   rule_list.push_back(Rule("ere", "bas", "ERE.BAS"));
   rule_list.push_back(Rule("mbc", "bin", "MBC"));
   rule_list.push_back(Rule("mbc", "bas", "MBC"));
   rule_list.push_back(Rule("esat", "bas", "ESAT"));
   rule_list.push_back(Rule("esat", "bin", "ESAT"));
   rule_list.push_back(Rule("esat", "", "ESAT"));
   rule_list.push_back(Rule("jeu", "bin", "JEU"));
   rule_list.push_back(Rule("jeu", "bas", "JEU"));

   for (auto it = rule_list.begin(); it != rule_list.end() && (end == false); it++)
   {
      if (FindName(filename_vector, it->name_, it->ext_))
      {
         strcpy(buffer, it->autofile_);
         end = true;
      }
   }

   // Other rules
   bool ext_binbas = false;

   if (end == false)
   {
      for (auto it = filename_vector.begin(); it != filename_vector.end(); it++)
      {
         unsigned char filename[16] = {0};
         memcpy(filename, it->c_str(), 13);
         filename[9] = filename[9] & 0x7F; // READ ONLY
         filename[8] = filename[8] & 0x7F; // HIDDEN / SYSTEM
         bool bnewbinbas = false;
         if (strnicmp((char*)&filename[8], "bin", 3) == 0
            || strnicmp((char*)&filename[8], "bas", 3) == 0
            || strnicmp((char*)&filename[8], "   ", 3) == 0)
         {
            // Priority : If it's call "sav?????.b??", it's less priority thant any other
            int nbcar = NbIdenticalCar(it->c_str(), disk_filename.c_str(), disk_filename.size());
            if (strncmp(&it->c_str()[8], "BIN", 3) == 0
               || strncmp(&it->c_str()[8], "BAS", 3) == 0
            )
               bnewbinbas = true;
            if (nbcar > nb_correct_char || nb_correct_char == 0 || (correct_hidden == true && ((it->c_str()[9] & 0x80)
               == 0)) || (bnewbinbas == true && ext_binbas == false))
            {
               if (correct_hidden == false && (it->c_str()[9] & 0x80) == 0x80)
               {
               }
               else if (bnewbinbas == false && ext_binbas == true)
               {
               }
               else
               {
                  // Update return;
                  nb_correct_char = nbcar;
                  ext_binbas = bnewbinbas;

                  correct_hidden = it->c_str()[9] & 0x80;
                  sprintf(buffer, "%8.8s", it->c_str() /*, (char*)&pTrackData[offset+8]*/);
                  for (int i = 7; i >= 0; i--)
                  {
                     if (buffer[i] == 0x20) buffer[i] = 0x00;
                     else break;
                  }
               }
            }
         }
      }
   }

   if (end || strlen(buffer) > 0)
      ret = IDisk::AUTO_FILE;

   return ret;
}